

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fight.c
# Opt level: O2

void do_disengage(CHAR_DATA *ch,char *argument)

{
  CHAR_DATA *arg2;
  char *txt;
  
  arg2 = ch->fighting;
  if (arg2 == (CHAR_DATA *)0x0) {
    txt = "You aren\'t fighting anyone!\n\r";
  }
  else {
    if (arg2->fighting != ch) {
      act("You cease attacking $N.",ch,(void *)0x0,arg2,3);
      act("$n ceases attacking you.",ch,(void *)0x0,ch->fighting,2);
      act("$n ceases attacking $N.",ch,(void *)0x0,ch->fighting,1);
      stop_fighting(ch,false);
      WAIT_STATE(ch,0xc);
      return;
    }
    txt = "It\'s called fleeing.  Look into it.\n\r";
  }
  send_to_char(txt,ch);
  return;
}

Assistant:

void do_disengage(CHAR_DATA *ch, char *argument)
{
	if (!ch->fighting)
	{
		send_to_char("You aren't fighting anyone!\n\r", ch);
		return;
	}

	if (ch->fighting->fighting == ch)
	{
		send_to_char("It's called fleeing.  Look into it.\n\r", ch);
		return;
	}

	act("You cease attacking $N.", ch, 0, ch->fighting, TO_CHAR);
	act("$n ceases attacking you.", ch, 0, ch->fighting, TO_VICT);
	act("$n ceases attacking $N.", ch, 0, ch->fighting, TO_NOTVICT);

	stop_fighting(ch, false);

	WAIT_STATE(ch, PULSE_VIOLENCE);
}